

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkPreprocessing::clear_preprocessor
          (NeuralNetworkPreprocessing *this)

{
  PreprocessorCase PVar1;
  NeuralNetworkPreprocessing *this_local;
  
  PVar1 = preprocessor_case(this);
  if (PVar1 != PREPROCESSOR_NOT_SET) {
    if (PVar1 == kScaler) {
      if ((this->preprocessor_).scaler_ != (NeuralNetworkImageScaler *)0x0) {
        (*(((this->preprocessor_).scaler_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if ((PVar1 == kMeanImage) &&
            ((this->preprocessor_).scaler_ != (NeuralNetworkImageScaler *)0x0)) {
      (*(((this->preprocessor_).scaler_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void NeuralNetworkPreprocessing::clear_preprocessor() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.NeuralNetworkPreprocessing)
  switch (preprocessor_case()) {
    case kScaler: {
      delete preprocessor_.scaler_;
      break;
    }
    case kMeanImage: {
      delete preprocessor_.meanimage_;
      break;
    }
    case PREPROCESSOR_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = PREPROCESSOR_NOT_SET;
}